

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::cmCopyFile(char *source,char *destination)

{
  char *pcVar1;
  bool bVar2;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  char *local_18;
  char *destination_local;
  char *source_local;
  
  local_18 = destination;
  destination_local = source;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,source,&local_39);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,pcVar1,&local_71);
  bVar2 = cmsys::SystemTools::CopyFileAlways(&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return bVar2;
}

Assistant:

bool cmSystemTools::cmCopyFile(const char* source, const char* destination)
{
  return Superclass::CopyFileAlways(source, destination);
}